

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O0

void __thiscall HighsSimplexAnalysis::reportFactorTimer(HighsSimplexAnalysis *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  long in_RDI;
  HighsTimerClock *in_stack_00000018;
  FactorTimer *in_stack_00000020;
  HighsInt thread_factor_iClock;
  HighsInt all_factor_iClock;
  HighsInt clock_id;
  vector<int,_std::allocator<int>_> *thread_clock;
  HighsInt i_1;
  vector<int,_std::allocator<int>_> *clock;
  HighsTimerClock all_factor_clocks;
  HighsTimer *timer_pointer;
  HighsInt i;
  HighsInt max_threads;
  FactorTimer factor_timer;
  HighsTimerClock *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  value_type in_stack_ffffffffffffff74;
  int local_64;
  int local_58;
  vector<int,_std::allocator<int>_> local_38;
  HighsTimer *local_20;
  uint local_14;
  uint local_10;
  
  local_10 = ::highs::parallel::num_threads();
  for (local_14 = 0; (int)local_14 < (int)local_10; local_14 = local_14 + 1) {
    printf("reportFactorTimer: HFactor clocks for thread %d / %d\n",(ulong)local_14,
           (ulong)(local_10 - 1));
    std::vector<HighsTimerClock,_std::allocator<HighsTimerClock>_>::operator[]
              ((vector<HighsTimerClock,_std::allocator<HighsTimerClock>_> *)(in_RDI + 0x20),
               (long)(int)local_14);
    FactorTimer::reportFactorClock
              ((FactorTimer *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
  }
  if (1 < (int)local_10) {
    pvVar4 = std::vector<HighsTimerClock,_std::allocator<HighsTimerClock>_>::operator[]
                       ((vector<HighsTimerClock,_std::allocator<HighsTimerClock>_> *)(in_RDI + 0x20)
                        ,0);
    local_20 = pvVar4->timer_pointer_;
    HighsTimerClock::HighsTimerClock((HighsTimerClock *)0x7b6b32);
    FactorTimer::initialiseFactorClocks(in_stack_00000020,in_stack_00000018);
    for (local_58 = 0; local_58 < (int)local_10; local_58 = local_58 + 1) {
      pvVar4 = std::vector<HighsTimerClock,_std::allocator<HighsTimerClock>_>::operator[]
                         ((vector<HighsTimerClock,_std::allocator<HighsTimerClock>_> *)
                          (in_RDI + 0x20),(long)local_58);
      for (local_64 = 0; local_64 < 0x27; local_64 = local_64 + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(long)local_64);
        iVar2 = *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&pvVar4->clock_,(long)local_64);
        iVar3 = *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&local_20->clock_num_call,(long)iVar3);
        in_stack_ffffffffffffff74 = *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&local_20->clock_num_call,(long)iVar2);
        *pvVar5 = in_stack_ffffffffffffff74 + *pvVar5;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_20->clock_time,(long)iVar3);
        dVar1 = *pvVar6;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_20->clock_time,(long)iVar2);
        *pvVar6 = dVar1 + *pvVar6;
      }
    }
    printf("reportFactorTimer: HFactor clocks for all %d threads\n",(ulong)local_10);
    FactorTimer::reportFactorClock
              ((FactorTimer *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
    HighsTimerClock::~HighsTimerClock((HighsTimerClock *)0x7b6caf);
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::reportFactorTimer() {
  assert(analyse_factor_time);
  FactorTimer factor_timer;
  HighsInt max_threads = highs::parallel::num_threads();
  for (HighsInt i = 0; i < max_threads; i++) {
    //  for (HighsTimerClock clock : thread_factor_clocks) {
    printf("reportFactorTimer: HFactor clocks for thread %" HIGHSINT_FORMAT
           " / %" HIGHSINT_FORMAT "\n",
           i, max_threads - 1);
    factor_timer.reportFactorClock(thread_factor_clocks[i]);
  }
  if (max_threads > 1) {
    HighsTimer* timer_pointer = thread_factor_clocks[0].timer_pointer_;
    HighsTimerClock all_factor_clocks;
    all_factor_clocks.timer_pointer_ = timer_pointer;
    vector<HighsInt>& clock = all_factor_clocks.clock_;
    factor_timer.initialiseFactorClocks(all_factor_clocks);
    for (HighsInt i = 0; i < max_threads; i++) {
      vector<HighsInt>& thread_clock = thread_factor_clocks[i].clock_;
      for (HighsInt clock_id = 0; clock_id < FactorNumClock; clock_id++) {
        HighsInt all_factor_iClock = clock[clock_id];
        HighsInt thread_factor_iClock = thread_clock[clock_id];
        timer_pointer->clock_num_call[all_factor_iClock] +=
            timer_pointer->clock_num_call[thread_factor_iClock];
        timer_pointer->clock_time[all_factor_iClock] +=
            timer_pointer->clock_time[thread_factor_iClock];
      }
    }
    printf("reportFactorTimer: HFactor clocks for all %" HIGHSINT_FORMAT
           " threads\n",
           max_threads);
    factor_timer.reportFactorClock(all_factor_clocks);
  }
}